

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

int deflateResetKeep(z_stream *strm)

{
  deflate_state *s_00;
  int iVar1;
  uint32_t uVar2;
  deflate_state *s;
  z_stream *strm_local;
  
  iVar1 = deflateStateCheck(strm);
  if (iVar1 == 0) {
    strm->total_out = 0;
    strm->total_in = 0;
    strm->msg = (char *)0x0;
    strm->data_type = 2;
    s_00 = strm->state;
    s_00->pending = 0;
    s_00->pending_out = s_00->pending_buf;
    if (s_00->wrap < 0) {
      s_00->wrap = -s_00->wrap;
    }
    iVar1 = 1;
    if (s_00->wrap == 2) {
      iVar1 = 4;
    }
    s_00->status = iVar1;
    if (s_00->wrap == 2) {
      uVar2 = crc32_fold_reset_c(&s_00->crc_fold);
      strm->adler = (ulong)uVar2;
    }
    else {
      strm->adler = 1;
    }
    s_00->last_flush = -2;
    zng_tr_init(s_00);
    strm_local._4_4_ = 0;
  }
  else {
    strm_local._4_4_ = -2;
  }
  return strm_local._4_4_;
}

Assistant:

int32_t Z_EXPORT PREFIX(deflateResetKeep)(PREFIX3(stream) *strm) {
    deflate_state *s;

    if (deflateStateCheck(strm))
        return Z_STREAM_ERROR;

    strm->total_in = strm->total_out = 0;
    strm->msg = NULL; /* use zfree if we ever allocate msg dynamically */
    strm->data_type = Z_UNKNOWN;

    s = (deflate_state *)strm->state;
    s->pending = 0;
    s->pending_out = s->pending_buf;

    if (s->wrap < 0)
        s->wrap = -s->wrap; /* was made negative by deflate(..., Z_FINISH); */

    s->status =
#ifdef GZIP
        s->wrap == 2 ? GZIP_STATE :
#endif
        INIT_STATE;

#ifdef GZIP
    if (s->wrap == 2) {
        strm->adler = FUNCTABLE_CALL(crc32_fold_reset)(&s->crc_fold);
    } else
#endif
        strm->adler = ADLER32_INITIAL_VALUE;
    s->last_flush = -2;

    zng_tr_init(s);

    DEFLATE_RESET_KEEP_HOOK(strm);  /* hook for IBM Z DFLTCC */

    return Z_OK;
}